

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O0

bool __thiscall Satyricon::SATSolver::solve(SATSolver *this)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  size_type sVar4;
  void *pvVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  Literal local_40;
  int local_3c;
  Literal l;
  int backtrack_level;
  ClausePtr conflict;
  uint local_28;
  uint increase_limit_counter;
  uint increase_limit_threshold;
  uint learn_limit;
  uint restart_counter;
  uint conflict_counter;
  SATSolver *this_local;
  
  if (0 < this->log_level) {
    poVar3 = std::operator<<((ostream *)&std::cout,"begin solve");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  learn_limit = 0;
  increase_limit_threshold = 0;
  sVar4 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::size
                    (&this->clauses);
  auVar7._8_4_ = (int)(sVar4 >> 0x20);
  auVar7._0_8_ = sVar4;
  auVar7._12_4_ = 0x45300000;
  increase_limit_counter =
       (uint)(long)(((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                   (this->param).initial_learn_mult);
  uVar1 = new_restart_threshold(this);
  (this->param).restart_threshold = uVar1;
  local_28 = 100;
  conflict._4_4_ = 100;
  Literal_Order::initialize_heap(&this->order);
  if (((this->param).enable_preprocessing & 1U) != 0) {
    preprocessing(this);
  }
  print_status(this,0,0,increase_limit_counter);
  while( true ) {
    while( true ) {
      if (1 < this->log_level) {
        poVar3 = std::operator<<((ostream *)&std::cout,"propagate at level ");
        iVar2 = current_level(this);
        pvVar5 = (void *)std::ostream::operator<<(poVar3,iVar2);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      _l = propagation(this);
      if (_l != (ClausePtr)0x0) break;
      sVar6 = number_of_assigned_variable(this);
      if (sVar6 == this->number_of_variable) {
        if (1 < this->log_level) {
          poVar3 = std::operator<<((ostream *)&std::cout,"assinged all literals without conflict");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        build_sat_proof(this);
        print_status(this,learn_limit,increase_limit_threshold,increase_limit_counter);
        return true;
      }
      current_level(this);
      if ((((this->param).enable_deletion & 1U) != 0) &&
         (sVar4 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::size
                            (&this->learned), increase_limit_counter <= sVar4)) {
        reduce_learned(this);
      }
      if ((((this->param).enable_restart & 1U) != 0) &&
         ((this->param).restart_threshold <= learn_limit)) {
        increase_limit_threshold = increase_limit_threshold + 1;
        uVar1 = new_restart_threshold(this);
        (this->param).restart_threshold = uVar1 + (this->param).restart_threshold;
        if (1 < this->log_level) {
          poVar3 = std::operator<<((ostream *)&std::cout,"restarting. next restart at ");
          pvVar5 = (void *)std::ostream::operator<<(poVar3,(this->param).restart_threshold);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        }
        cancel_until(this,0);
      }
      local_40 = choice_lit(this);
      if (1 < this->log_level) {
        poVar3 = std::operator<<((ostream *)&std::cout,"decide literal ");
        poVar3 = operator<<(poVar3,&local_40);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      assume(this,local_40);
    }
    learn_limit = learn_limit + 1;
    iVar2 = current_level(this);
    if (iVar2 == 0) break;
    conflict._4_4_ = conflict._4_4_ - 1;
    if (conflict._4_4_ == 0) {
      conflict._4_4_ = (uint)(long)((double)local_28 * 1.5);
      increase_limit_counter =
           (int)(long)(((double)increase_limit_counter * (this->param).percentual_learn_increase) /
                      100.0) + increase_limit_counter;
      print_status(this,learn_limit,increase_limit_threshold,increase_limit_counter);
      local_28 = conflict._4_4_;
    }
    std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::clear
              (&this->solve_conflict_literals);
    conflict_analysis(this,_l,&this->solve_conflict_literals,&local_3c);
    cancel_until(this,local_3c);
    learn_clause(this,&this->solve_conflict_literals);
    literals_activity_decay(this);
    clause_activity_decay(this);
  }
  if (1 < this->log_level) {
    poVar3 = std::operator<<((ostream *)&std::cout,"conflict at level 0, build unsat proof");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  print_status(this,learn_limit,increase_limit_threshold,increase_limit_counter);
  return false;
}

Assistant:

bool SATSolver::solve() {
    // main method
    PRINT("begin solve" << endl);

    // initialize search parameter
    unsigned int conflict_counter = 0;
    unsigned int restart_counter = 0;
    unsigned int learn_limit = static_cast<unsigned int>(
            static_cast<double>(clauses.size())*param.initial_learn_mult );
    param.restart_threshold = new_restart_threshold();

    unsigned int increase_limit_threshold = 100;
    unsigned int increase_limit_counter = increase_limit_threshold;

    // order literal for decision
    order.initialize_heap();

    // preprocess
    if ( param.enable_preprocessing) { preprocessing(); }

    print_status(conflict_counter,restart_counter, learn_limit);
    while ( true ) { // loop until a solution is found

        PRINT_VERBOSE("propagate at level " << current_level() << endl);
        // propagate assingment effect
        ClausePtr conflict = propagation();

        if ( conflict != nullptr ) {

            conflict_counter++;

            // if a conflict is found on level 0, it is impossible to solve
            // so the formula must be unsatisfiable
            if ( current_level() == 0 ) {
                PRINT_VERBOSE("conflict at level 0, build unsat proof" << endl);
                print_status(conflict_counter,restart_counter, learn_limit);
                return false; // UNSAT
            }

            if ( --increase_limit_counter == 0 ) {
                increase_limit_threshold *= 1.5;
                increase_limit_counter = increase_limit_threshold;
                learn_limit += static_cast<unsigned int>(
                        (learn_limit*param.percentual_learn_increase)/100.0);

                print_status(conflict_counter,restart_counter, learn_limit);
            }
            // otherwise, analize the conflict and backtrack

            int backtrack_level;
            solve_conflict_literals.clear();
            conflict_analysis(conflict,solve_conflict_literals,backtrack_level);

            cancel_until( backtrack_level );
            learn_clause(solve_conflict_literals); // learn the conflcit clause

            // after a conflict, the activity of literals and clauses decay
            literals_activity_decay();
            clause_activity_decay();
        }
        else {
            // no conflict and no more value to propagate

            // if all variables are asigned, the problem is satisfiable
            if ( number_of_assigned_variable() == number_of_variable ) {
                PRINT_VERBOSE("assinged all literals without conflict" << endl);
                build_sat_proof();
                print_status(conflict_counter,restart_counter, learn_limit);
                return true; // SAT
            }

            if ( current_level() == 0 ) {
                //simplify(clauses);
                //simplify(learned);
            }

            // if the learning limit is reached, the learned clause must
            // be reduced, the new learning limit is now higher
            if ( param.enable_deletion && learned.size() >= learn_limit ) {
                // cast for suppres warning
                reduce_learned();
            }

            if ( param.enable_restart &&
                    conflict_counter >= param.restart_threshold ) {
                // if the restart limit is reached, bactrack to level zero
                // and select the new threshold for the restart process
                restart_counter++;
                param.restart_threshold += new_restart_threshold();
                PRINT_VERBOSE("restarting. next restart at "<<
                        param.restart_threshold<< endl);
                cancel_until(0);
            }

            // open a new decision level and decide a new literal
            // based on the vsids heuristic
            Literal l = choice_lit();
            PRINT_VERBOSE("decide literal " << l << endl);
            assume(l);
        }
    }
}